

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transportParser.h
# Opt level: O0

void __thiscall IO::TransportParser::~TransportParser(TransportParser *this)

{
  TransportParser *this_local;
  
  std::__cxx11::string::~string((string *)&this->transportfilestring_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~TransportParser(){}